

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugger.cxx
# Opt level: O0

vector<cmBreakpoint,_std::allocator<cmBreakpoint>_> * __thiscall
cmDebugger_impl::GetBreakpoints
          (vector<cmBreakpoint,_std::allocator<cmBreakpoint>_> *__return_storage_ptr__,
          cmDebugger_impl *this)

{
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> l;
  cmDebugger_impl *this_local;
  
  l._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->breakpointMutex);
  std::vector<cmBreakpoint,_std::allocator<cmBreakpoint>_>::vector
            (__return_storage_ptr__,&this->breakpoints);
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return __return_storage_ptr__;
}

Assistant:

std::vector<cmBreakpoint> GetBreakpoints() const override
  {
    std::lock_guard<std::mutex> l(breakpointMutex);
    return breakpoints;
  }